

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin-ratelimit.hh
# Opt level: O1

void __thiscall
discordpp::
PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>
::do_some_work(PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>
               *this)

{
  undefined1 *puVar1;
  long lVar2;
  _Base_ptr p_Var3;
  element_type *peVar4;
  element_type *method;
  PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>
  *pPVar5;
  int iVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  size_t sVar11;
  _Rb_tree_node_base *p_Var12;
  _Base_ptr p_Var13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  ulong uVar15;
  long lVar16;
  _Rb_tree_node_base *p_Var17;
  _Base_ptr p_Var18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar19;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::queue<std::shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo>,_std::deque<std::shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo>,_std::allocator<std::shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo>_>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::queue<std::shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo>,_std::deque<std::shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo>,_std::allocator<std::shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo>_>_>_>_>_>_>
  pVar20;
  route_t next_route;
  key_type_conflict local_1a8;
  undefined1 local_199;
  CountedSet<unsigned_long> *local_198;
  _Rb_tree_node_base *local_190;
  _Rb_tree_node_base *local_188;
  PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>
  *local_180;
  ulong local_178;
  _Rb_tree_node_base *local_170;
  sptr<const_handleWrite> local_168;
  anon_class_16_1_898d11ac *local_158;
  undefined8 uStack_150;
  code *local_148;
  code *pcStack_140;
  anon_class_32_3_d47dc058 local_138;
  sptr<const_handleRead> local_118;
  sptr<RenderedCall> local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  code *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  code *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  code *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  code *local_88;
  code *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  code *local_68;
  code *local_60;
  anon_class_32_3_d47dc058 local_50;
  
  local_78 = 0;
  uStack_70 = 0;
  local_60 = std::
             _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:69:30)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:69:30)>
             ::_M_manager;
  if (log::filter < 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)log::out,"Check about doing work...",0x19);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  if (((this->
       super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
       ).
       super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
       .field_0xfd == '\0') &&
     ((this->
      super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
      ).
      super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
      .field_0x168 != '\x01')) {
    (this->
    super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
    ).
    super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
    .field_0xfd = 1;
    local_b8 = 0;
    uStack_b0 = 0;
    local_a0 = std::
               _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:80:30)>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:80:30)>
               ::_M_manager;
    if (log::filter < 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)log::out," Can work...",0xc);
    }
    if (local_a8 != (code *)0x0) {
      (*local_a8)(&local_b8,&local_b8,3);
    }
    lVar16 = 0x7fffffffffffffff;
    local_1a8 = 0;
    uVar19 = (ulong)*(int *)&(this->
                             super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                             ).
                             super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                             .field_0xf8;
    p_Var10 = *(_Rb_tree_node_base **)
               &(this->
                super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                ).field_0x1c0;
    p_Var12 = (_Rb_tree_node_base *)
              &(this->
               super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
               ).
               super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
               .field_0x1b0;
    local_180 = this;
    if (p_Var10 == p_Var12) {
      local_188 = (_Rb_tree_node_base *)0x0;
      p_Var17 = (_Rb_tree_node_base *)0x0;
    }
    else {
      local_190 = (_Rb_tree_node_base *)
                  &(this->
                   super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                   ).
                   super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                   .field_0x178;
      local_198 = (CountedSet<unsigned_long> *)
                  &(this->
                   super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                   ).field_0x1d8;
      p_Var17 = (_Rb_tree_node_base *)0x0;
      local_188 = (_Rb_tree_node_base *)0x0;
      local_170 = p_Var12;
      do {
        sVar7 = std::
                map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::count((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_190,&local_198->sum);
        if (sVar7 == 0) {
LAB_00187194:
          p_Var18 = (_Base_ptr)
                    ((long)&(p_Var10[4]._M_left)->_M_color +
                    *(long *)&(this->
                              super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                              ).
                              super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                              .field_0x130);
          uVar15 = (long)p_Var10[6]._M_left - (long)p_Var18;
          if (uVar15 < uVar19) {
            uVar19 = uVar15;
          }
          if (p_Var18 < p_Var10[6]._M_left) {
            p_Var9 = p_Var10[3]._M_right;
            p_Var12 = local_170;
            if (p_Var9 != (_Rb_tree_node_base *)&p_Var10[3]._M_parent) {
              local_178 = uVar19;
              do {
                if (p_Var9[2]._M_right == p_Var9[1]._M_right) {
                  __assert_fail("!qe.second.empty() && \"Encountered an empty queue in a bucket\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh"
                                ,0x66,
                                "void discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>>>>>>::do_some_work() [BASE = discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>>>>>]"
                               );
                }
                lVar2 = *(long *)(*(long *)p_Var9[1]._M_right + 0x18);
                if (lVar2 < lVar16) {
                  local_1a8 = *(key_type_conflict *)(p_Var9 + 1);
                  lVar16 = lVar2;
                  p_Var17 = p_Var10 + 2;
                  local_188 = p_Var10 + 3;
                }
                p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
                this = local_180;
                p_Var12 = local_170;
                uVar19 = local_178;
              } while (p_Var9 != (_Rb_tree_node_base *)&p_Var10[3]._M_parent);
            }
          }
        }
        else {
          pmVar8 = std::
                   map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_190,&local_198->sum);
          p_Var18 = (_Base_ptr)pmVar8->_M_string_length;
          if ((p_Var18 != p_Var10[2]._M_parent) ||
             (((p_Var18 != (_Base_ptr)0x0 &&
               (iVar6 = bcmp((pmVar8->_M_dataplus)._M_p,*(void **)(p_Var10 + 2),(size_t)p_Var18),
               iVar6 != 0)) || (p_Var10[4]._M_parent != (_Base_ptr)0x0)))) goto LAB_00187194;
        }
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      } while (p_Var10 != p_Var12);
    }
    p_Var12 = *(_Rb_tree_node_base **)
               &(this->
                super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                ).
                super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                .field_0x118;
    puVar1 = &(this->
              super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
              ).
              super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
              .field_0x108;
    local_178 = uVar19;
    if (p_Var12 != (_Rb_tree_node_base *)puVar1) {
      local_190 = (_Rb_tree_node_base *)
                  &(this->
                   super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                   ).
                   super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                   .field_0x100;
      local_198 = (CountedSet<unsigned_long> *)
                  &(this->
                   super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                   ).
                   super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                   .field_0x130;
      do {
        if (p_Var12[2]._M_right == p_Var12[1]._M_right) {
          __assert_fail("!qe.second.empty() && \"Encountered an empty global queue\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh"
                        ,0x73,
                        "void discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>>>>>>::do_some_work() [BASE = discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>>>>>]"
                       );
        }
        lVar2 = *(long *)(*(long *)p_Var12[1]._M_right + 0x18);
        if ((lVar2 < lVar16) ||
           ((((this->
              super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
              ).
              super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
              .field_0xfc == '\x01' && (p_Var17 != (_Rb_tree_node_base *)0x0)) &&
            (sVar11 = CountedSet<unsigned_long>::count(local_198,*(unsigned_long *)(p_Var12 + 1)),
            sVar11 == 0)))) {
          local_1a8 = *(key_type_conflict *)(p_Var12 + 1);
          local_188 = local_190;
          p_Var17 = (_Rb_tree_node_base *)0x0;
          lVar16 = lVar2;
        }
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
      } while (p_Var12 != (_Rb_tree_node_base *)puVar1);
    }
    if ((p_Var17 == (_Rb_tree_node_base *)0x0) &&
       ((*(long *)&(this->
                   super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
                   ).
                   super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
                   .field_0x128 == 0 || (local_178 == 0)))) {
      local_d8 = 0;
      uStack_d0 = 0;
      local_c0 = std::
                 _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:132:22)>
                 ::_M_invoke;
      local_c8 = std::
                 _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:132:22)>
                 ::_M_manager;
      if (log::filter < 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)log::out," Nothing to do.",0xf);
      }
      if (local_c8 != (code *)0x0) {
        (*local_c8)(&local_d8,&local_d8,3);
      }
      (this->
      super_PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>
      ).
      super_PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>
      .field_0xfd = 0;
    }
    else {
      local_f8 = 0;
      uStack_f0 = 0;
      local_e0 = std::
                 _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:137:30)>
                 ::_M_invoke;
      local_e8 = std::
                 _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:137:30)>
                 ::_M_manager;
      if (log::filter < 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)log::out," Queueing.",10);
      }
      p_Var12 = local_188;
      if (local_e8 != (code *)0x0) {
        (*local_e8)(&local_f8,&local_f8,3);
      }
      p_Var18 = (_Base_ptr)&p_Var12->_M_parent;
      p_Var13 = p_Var18;
      for (p_Var3 = p_Var12->_M_left; p_Var3 != (_Base_ptr)0x0;
          p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < local_1a8]) {
        if (*(ulong *)(p_Var3 + 1) >= local_1a8) {
          p_Var13 = p_Var3;
        }
      }
      if ((p_Var13 != p_Var18) && (*(ulong *)(p_Var13 + 1) <= local_1a8)) {
        p_Var18 = p_Var13;
      }
      peVar4 = *(element_type **)p_Var18[1]._M_right;
      p_Var3 = (p_Var18[1]._M_right)->_M_parent;
      if (p_Var3 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var3->_M_parent = *(int *)&p_Var3->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var3->_M_parent = *(int *)&p_Var3->_M_parent + 1;
        }
      }
      std::
      deque<std::shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo>,_std::allocator<std::shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo>_>_>
      ::pop_front((deque<std::shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo>,_std::allocator<std::shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo>_>_>
                   *)&p_Var18[1]._M_parent);
      if (p_Var18[2]._M_right == p_Var18[1]._M_right) {
        pVar20 = std::_Rb_tree<$e4f3d558$>::equal_range((_Rb_tree<_e4f3d558_> *)p_Var12,&local_1a8);
        std::_Rb_tree<$e4f3d558$>::_M_erase_aux
                  ((_Rb_tree<_e4f3d558_> *)p_Var12,(_Base_ptr)pVar20.first._M_node,
                   (_Base_ptr)pVar20.second._M_node);
      }
      pPVar5 = local_180;
      if (p_Var3 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var3->_M_parent = *(int *)&p_Var3->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var3->_M_parent = *(int *)&p_Var3->_M_parent + 1;
        }
      }
      local_148 = (code *)0x0;
      pcStack_140 = (code *)0x0;
      local_158 = (anon_class_16_1_898d11ac *)0x0;
      uStack_150 = 0;
      local_158 = (anon_class_16_1_898d11ac *)operator_new(0x10);
      (local_158->info).
      super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar4;
      (local_158->info).
      super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3;
      pcStack_140 = std::
                    _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:147:30)>
                    ::_M_invoke;
      local_148 = std::
                  _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:147:30)>
                  ::_M_manager;
      if (log::filter < 1) {
        do_some_work::anon_class_16_1_898d11ac::operator()(local_158,(ostream *)log::out);
      }
      if (local_148 != (code *)0x0) {
        (*local_148)(&local_158,&local_158,3);
      }
      method = (peVar4->call).
               super___shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_50.this = pPVar5;
      local_50.route = local_1a8;
      if (p_Var3 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var3->_M_parent = *(int *)&p_Var3->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var3->_M_parent = *(int *)&p_Var3->_M_parent + 1;
        }
      }
      local_168.super___shared_ptr<const_std::function<void_(bool)>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_50.info.
      super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar4;
      local_50.info.
      super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::function<void(bool)>const,std::allocator<std::function<void(bool)>>,discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>>>>>>::do_some_work()::_lambda(bool)_1_>
                (&local_168.
                  super___shared_ptr<const_std::function<void_(bool)>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(function<void_(bool)> **)&local_168,
                 (allocator<std::function<void_(bool)>_> *)&local_138,&local_50);
      local_138.this = pPVar5;
      local_138.route = local_1a8;
      if (p_Var3 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var3->_M_parent = *(int *)&p_Var3->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var3->_M_parent = *(int *)&p_Var3->_M_parent + 1;
        }
      }
      local_118.
      super___shared_ptr<const_std::function<void_(bool,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_138.info.
      super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar4;
      local_138.info.
      super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::function<void(bool,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>const,std::allocator<std::function<void(bool,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>>,discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>>>>>>::do_some_work()::_lambda(bool,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)_1_>
                (&local_118.
                  super___shared_ptr<const_std::function<void_(bool,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (function<void_(bool,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>
                  **)&local_118,
                 (allocator<std::function<void_(bool,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
                  *)&local_199,&local_138);
      local_108.super___shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
      p_Var14->_M_use_count = 1;
      p_Var14->_M_weak_count = 1;
      p_Var14->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0024ef00;
      BotStruct::RenderedCall::RenderedCall
                ((RenderedCall *)(p_Var14 + 1),&method->method,&method->target,&method->type,
                 &method->body,&local_168,&local_118);
      local_108.super___shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (RenderedCall *)(p_Var14 + 1);
      local_108.super___shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var14;
      RestSimpleWeb<discordpp::Bot>::doCall((RestSimpleWeb<discordpp::Bot> *)local_180,&local_108);
      if (local_108.
          super___shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_108.
                   super___shared_ptr<discordpp::BotStruct::RenderedCall,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_118.
          super___shared_ptr<const_std::function<void_(bool,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.
                   super___shared_ptr<const_std::function<void_(bool,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((_Base_ptr)
          local_138.info.
          super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_138.info.
                   super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_168.super___shared_ptr<const_std::function<void_(bool)>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_168.
                   super___shared_ptr<const_std::function<void_(bool)>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Base_ptr)
          local_50.info.
          super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.info.
                   super___shared_ptr<discordpp::PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>::CallInfo,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (p_Var3 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3);
      }
    }
  }
  else {
    local_98 = 0;
    uStack_90 = 0;
    local_80 = std::
               _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:75:22)>
               ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(std::basic_ostream<char,_std::char_traits<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/plugin-ratelimit/discordpp/plugin-ratelimit.hh:75:22)>
               ::_M_manager;
    if (log::filter < 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)log::out," Not now.",9);
    }
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,3);
    }
  }
  return;
}

Assistant:

void do_some_work() {
        log::log(log::trace, [](std::ostream *log) {
            *log << "Check about doing work...";
        });
        // If already looping don't start a new loop
        if (writing || blocked) {
            log::log(log::trace,
                     [](std::ostream *log) { *log << " Not now."; });
            return;
        }
        writing = true;

        log::log(log::trace, [](std::ostream *log) { *log << " Can work..."; });

        // Find queue that needs to be sent next
        Bucket *next_bucket = nullptr;
        QueueByRoute *next_queues = nullptr;
        route_t next_route = 0;
        std::size_t min_remaining = defaultLimit;
        std::time_t min = std::numeric_limits<std::time_t>::max();
        for (auto &be : buckets) {
            if (route_to_bucket.count(gateway_route) &&
                route_to_bucket[gateway_route] == be.second.id &&
                be.second.queues.empty())
                continue;
            min_remaining =
                std::min(min_remaining,
                         be.second.remaining -
                             (be.second.transit.total() + transit.total()));
            if (be.second.remaining <=
                be.second.transit.total() + transit.total())
                continue;
            for (auto &qe : be.second.queues) {
                assert(!qe.second.empty() &&
                       "Encountered an empty queue in a bucket");
                auto created = qe.second.front()->created;
                if (created < min) {
                    min = created;
                    next_bucket = &be.second;
                    next_queues = &be.second.queues;
                    next_route = qe.first;
                }
            }
        }

        // `queues` may be empty
        for (auto &qe : queues) {
            assert(!qe.second.empty() && "Encountered an empty global queue");
            auto created = qe.second.front()->created;
            if (created < min || (unknownFirst && next_bucket != nullptr &&
                                  !transit.count(qe.first))) {
                min = created;
                next_bucket = nullptr;
                next_queues = &queues;
                next_route = qe.first;
            }
        }

        // Can we send a message?
        // If we found a next bucket, yes.
        // If the uncategorized queue isn't empty and there's no chance of
        // overflowing a bucket, yes.
        if (!next_bucket && (queues.empty() || min_remaining <= 0)) {
            log::log(log::trace,
                     [](std::ostream *log) { *log << " Nothing to do."; });
            writing = false;
            return;
        }

        log::log(log::trace, [](std::ostream *log) { *log << " Queueing."; });

        // Get the next call and delete its queue if empty
        auto next_queue = next_queues->find(next_route);
        auto info = next_queue->second.front();
        next_queue->second.pop();
        if (next_queue->second.empty()) {
            next_queues->erase(next_route);
        }

        log::log(log::trace, [info](std::ostream *log) {
            *log << "Plugin: RateLimit: "
                 << "Sending " << *info->call->target;
            if (info->call != nullptr) {
                *log << ' ' << *info->call->target;
                if (info->call->body) {
                    *log << info->call->body;
                } else {
                    *log << " with no body";
                }
            }
            *log << '\n';
        });

        // Do the call
        // Note: We are binding raw pointers and we must guarantee their
        // lifetimes
        // Note: `BASE::doCall` is used directly here as `Call::run` would
        // result in an infinite loop
        BASE::doCall(std::make_shared<RenderedCall>(
            info->call->method, info->call->target, info->call->type,
            info->call->body,
            std::make_shared<const handleWrite>(
                [this, route = next_route,
                 info](bool error) { // When the call is sent
                    info->writeFailed = error;

                    if (!error) {
                        // Mark the message as counting against rate
                        // limits while in transit
                        (route_to_bucket.count(route)
                             ? buckets[route_to_bucket[route]].transit
                             : transit)
                            .insert(route);
                    }
                    writing = false;

                    // Check if the cycle continues
                    aioc->post([this] { do_some_work(); });

                    // Run the user's onWrite callback
                    if (info->call->onWrite != nullptr) {
                        (*info->call->onWrite)(error);
                    }
                }),
            std::make_shared<const handleRead>([this, route = next_route,
                                                info](bool error,
                                                      const json &
                                                          msg) { // When Discord
                                                                 // replies
                // Get the current bucket
                auto *bucket = (route_to_bucket.count(route)
                                    ? &buckets[route_to_bucket[route]]
                                    : nullptr);

                // This message is no longer in transit
                if (!info->writeFailed) {
                    (bucket ? bucket->transit : transit).erase(route);
                }

                if (msg.contains("header") &&
                    (!error || msg["result"].get<int>() == 429)) {
                    auto &headers = msg["header"];
                    { // Find the new bucket and transfer other messages
                      // with the same route
                        auto new_id =
                            headers["X-RateLimit-Bucket"].get<std::string>();
                        if (!bucket || bucket->id != new_id) {
                            auto *old_bucket = bucket;

                            route_to_bucket[route] = new_id;
                            bucket = &buckets.emplace(new_id, Bucket{new_id})
                                          .first->second;

                            log::log(log::trace, [old_bucket,
                                                  bucket](std::ostream *log) {
                                *log << "Migrating from "
                                     << (old_bucket ? old_bucket->id : "global")
                                     << " to " << bucket->id << '\n';
                            });

                            bucket->queues.insert(
                                (old_bucket ? old_bucket->queues : queues)
                                    .extract(route));
                            (old_bucket ? old_bucket->transit : transit)
                                .move(bucket->transit, route);
                        }
                    }

                    // If ratelimited
                    if (msg["result"].get<int>() == 429) {
                        if (msg["body"]["global"]) { // If global, block all
                                                     // messages
                            blocked = true;
                            reset.reset();
                            reset = std::make_unique<asio::steady_timer>(*aioc);
                            reset->expires_after(std::chrono::seconds(
                                msg["body"]["retry_after"].get<int>()));
                            reset->async_wait([this](const error_code &e) {
                                // Don't reset the limit if the timer is
                                // cancelled
                                if (e) {
                                    return;
                                }
                                log::log(log::trace, [](std::ostream *log) {
                                    *log << "Global rate limit has "
                                            "elapsed.\n";
                                });
                                // Reset the limit
                                blocked = false;
                                // Kickstart the message sending process
                                aioc->post([this] { do_some_work(); });
                            });
                        } else { // Otherwise block this bucket
                            bucket->remaining = 0;
                            bucket->reset.reset();
                            bucket->reset =
                                std::make_unique<asio::steady_timer>(*aioc);
                            bucket->reset->expires_after(std::chrono::seconds(
                                msg["body"]["retry_after"].get<int>()));
                            bucket->reset->async_wait(
                                [this, owner = bucket](const error_code &e) {
                                    // Don't reset the limit if the timer is
                                    // cancelled
                                    if (e) {
                                        return;
                                    }
                                    log::log(log::trace,
                                             [owner](std::ostream *log) {
                                                 *log << "Limit reset for "
                                                      << owner->id << '\n';
                                             });
                                    // Reset the limit
                                    owner->remaining = owner->limit;
                                    // Kickstart the message sending process
                                    aioc->post([this] { do_some_work(); });
                                });
                        }

                        // Requeue this call
                        doCall(info->call);

                        return;
                    }

                    // Set the buckets new limits
                    bucket->limit = stox<std::size_t>(
                        headers["X-RateLimit-Limit"].get<std::string>());
                    bucket->remaining = std::min(
                        bucket->remaining,
                        stox<std::size_t>(headers["X-RateLimit-Remaining"]
                                              .get<std::string>()));

                    // Set a time for expiration of said limits
                    bucket->reset.reset();
                    bucket->reset = std::make_unique<asio::steady_timer>(*aioc);
                    bucket->reset->expires_after(
                        std::chrono::milliseconds(std::stoi(std::regex_replace(
                            headers["X-RateLimit-Reset-After"]
                                .get<std::string>(),
                            std::regex(R"([\D])"), ""))));
                    bucket->reset->async_wait(
                        [this, owner = bucket](const error_code &e) {
                            // Don't reset the limit if the timer is
                            // cancelled
                            if (e) {
                                return;
                            }
                            log::log(log::trace, [owner](std::ostream *log) {
                                *log << "Limit reset for " << owner->id << '\n';
                            });
                            // Reset the limit
                            owner->remaining = owner->limit;
                            // Kickstart the message sending process
                            aioc->post([this] { do_some_work(); });
                        });
                }

                // Run the user's onRead callback
                if (info->call->onRead != nullptr) {
                    (*info->call->onRead)(error, msg);
                }
            })));
    }